

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

void __thiscall wabt::anon_unknown_0::CWriter::WriteTableType(CWriter *this,Type *type)

{
  Enum EVar1;
  size_t size;
  char *__s;
  
  EVar1 = type->enum_;
  if (EVar1 == ExnRef) {
    __s = "exnref";
  }
  else if (EVar1 == FuncRef) {
    __s = "funcref";
  }
  else {
    if (EVar1 != ExternRef) {
      abort();
    }
    __s = "externref";
  }
  WriteData(this,"wasm_rt_",8);
  size = strlen(__s);
  WriteData(this,__s,size);
  WriteData(this,"_table_t",8);
  return;
}

Assistant:

void CWriter::WriteTableType(const wabt::Type& type) {
  Write("wasm_rt_", GetReferenceTypeName(type), "_table_t");
}